

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.cpp
# Opt level: O1

string * __thiscall
Sock::RecvUntilTerminator_abi_cxx11_
          (string *__return_storage_ptr__,Sock *this,uint8_t terminator,milliseconds timeout,
          CThreadInterrupt *interrupt,size_t max_data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  time_point tVar5;
  undefined4 extraout_var;
  char *pcVar6;
  int *piVar7;
  int extraout_var_00;
  runtime_error *prVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  bool bVar13;
  long *args_2;
  long in_FS_OFFSET;
  ssize_t read_ret;
  ssize_t peek_ret;
  size_t try_len;
  char buf [512];
  char *local_290;
  char *local_288;
  uint8_t local_279;
  char *local_278 [4];
  string local_258;
  string local_238 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  args_2 = (long *)max_data;
  local_279 = terminator;
  tVar5 = NodeClock::now();
  lVar9 = (long)tVar5.__d.__r / 1000000 + timeout.__r;
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar13 = false;
  do {
    uVar10 = max_data - __return_storage_ptr__->_M_string_length;
    if (max_data < __return_storage_ptr__->_M_string_length || uVar10 == 0) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_258._M_dataplus._M_p = (pointer)__return_storage_ptr__->_M_string_length;
      tinyformat::format<unsigned_long>
                (local_238,"Received too many bytes without a terminator (%u)",
                 (unsigned_long *)&local_258);
      std::runtime_error::runtime_error(prVar8,(string *)local_238);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00df3918;
    }
    if (0x1ff < uVar10) {
      uVar10 = 0x200;
    }
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
    iVar4 = (*this->_vptr_Sock[4])(this,local_238,uVar10);
    local_288 = (char *)CONCAT44(extraout_var,iVar4);
    if (local_288 == (char *)0xffffffffffffffff) {
      piVar7 = __errno_location();
      iVar4 = *piVar7;
      if (((iVar4 != 4) && (iVar4 != 0xb)) && (iVar4 != 0x73)) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        SysErrorString_abi_cxx11_((int)((ulong)paVar1 >> 0x20));
        tinyformat::format<std::__cxx11::string>
                  (&local_258,(tinyformat *)"recv(): %s",(char *)local_278,args);
        std::runtime_error::runtime_error(prVar8,(string *)&local_258);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00df3918;
      }
LAB_00df3497:
      tVar5 = NodeClock::now();
      lVar12 = lVar9 - (long)tVar5.__d.__r / 1000000;
      if (lVar12 == 0 || lVar9 < (long)tVar5.__d.__r / 1000000) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_278[0] = (char *)__return_storage_ptr__->_M_string_length;
        tinyformat::format<unsigned_long>
                  (&local_258,"Receive timeout (received %u bytes without terminator before that)",
                   (unsigned_long *)local_278);
        std::runtime_error::runtime_error(prVar8,(string *)&local_258);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00df3918;
      }
      bVar3 = CThreadInterrupt::operator_cast_to_bool(interrupt);
      if (bVar3) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_278[0] = (char *)__return_storage_ptr__->_M_string_length;
        tinyformat::format<unsigned_long>
                  (&local_258,
                   "Receive interrupted (received %u bytes without terminator before that)",
                   (unsigned_long *)local_278);
        std::runtime_error::runtime_error(prVar8,(string *)&local_258);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00df3918;
      }
      if (999 < lVar12) {
        lVar12 = 1000;
      }
      bVar3 = true;
      (*this->_vptr_Sock[0xe])(this,lVar12,1,0);
    }
    else {
      if (local_288 == (char *)0x0) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar8,"Connection unexpectedly closed by peer");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00df3918;
      }
      pcVar11 = local_288 + (long)&local_238[0]._M_dataplus;
      pcVar6 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                         (local_238,pcVar11,&local_279);
      local_278[0] = local_288;
      if (pcVar6 != pcVar11) {
        local_278[0] = pcVar6 + (1 - (long)local_238);
      }
      iVar4 = (*this->_vptr_Sock[4])(this,local_238,local_278[0],0);
      local_290 = (char *)CONCAT44(extraout_var_00,iVar4);
      if ((extraout_var_00 < 0) || (local_290 != local_278[0])) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        tinyformat::format<long,unsigned_long,long>
                  (&local_258,
                   (tinyformat *)
                   "recv() returned %u bytes on attempt to read %u bytes but previous peek claimed %u bytes are available"
                   ,(char *)&local_290,(long *)local_278,(unsigned_long *)&local_288,args_2);
        std::runtime_error::runtime_error(prVar8,(string *)&local_258);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00df3918;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                (__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,(char *)local_238
                 ,(long)local_278[0] - (ulong)(pcVar6 != pcVar11));
      bVar13 = (bool)(bVar13 | pcVar6 != pcVar11);
      if (pcVar6 == pcVar11) goto LAB_00df3497;
      bVar3 = false;
    }
  } while (bVar3);
  if ((!bVar13) &&
     (pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)pcVar2 != paVar1)) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00df3918:
  __stack_chk_fail();
}

Assistant:

std::string Sock::RecvUntilTerminator(uint8_t terminator,
                                      std::chrono::milliseconds timeout,
                                      CThreadInterrupt& interrupt,
                                      size_t max_data) const
{
    const auto deadline = GetTime<std::chrono::milliseconds>() + timeout;
    std::string data;
    bool terminator_found{false};

    // We must not consume any bytes past the terminator from the socket.
    // One option is to read one byte at a time and check if we have read a terminator.
    // However that is very slow. Instead, we peek at what is in the socket and only read
    // as many bytes as possible without crossing the terminator.
    // Reading 64 MiB of random data with 262526 terminator chars takes 37 seconds to read
    // one byte at a time VS 0.71 seconds with the "peek" solution below. Reading one byte
    // at a time is about 50 times slower.

    for (;;) {
        if (data.size() >= max_data) {
            throw std::runtime_error(
                strprintf("Received too many bytes without a terminator (%u)", data.size()));
        }

        char buf[512];

        const ssize_t peek_ret{Recv(buf, std::min(sizeof(buf), max_data - data.size()), MSG_PEEK)};

        switch (peek_ret) {
        case -1: {
            const int err{WSAGetLastError()};
            if (IOErrorIsPermanent(err)) {
                throw std::runtime_error(strprintf("recv(): %s", NetworkErrorString(err)));
            }
            break;
        }
        case 0:
            throw std::runtime_error("Connection unexpectedly closed by peer");
        default:
            auto end = buf + peek_ret;
            auto terminator_pos = std::find(buf, end, terminator);
            terminator_found = terminator_pos != end;

            const size_t try_len{terminator_found ? terminator_pos - buf + 1 :
                                                    static_cast<size_t>(peek_ret)};

            const ssize_t read_ret{Recv(buf, try_len, 0)};

            if (read_ret < 0 || static_cast<size_t>(read_ret) != try_len) {
                throw std::runtime_error(
                    strprintf("recv() returned %u bytes on attempt to read %u bytes but previous "
                              "peek claimed %u bytes are available",
                              read_ret, try_len, peek_ret));
            }

            // Don't include the terminator in the output.
            const size_t append_len{terminator_found ? try_len - 1 : try_len};

            data.append(buf, buf + append_len);

            if (terminator_found) {
                return data;
            }
        }

        const auto now = GetTime<std::chrono::milliseconds>();

        if (now >= deadline) {
            throw std::runtime_error(strprintf(
                "Receive timeout (received %u bytes without terminator before that)", data.size()));
        }

        if (interrupt) {
            throw std::runtime_error(strprintf(
                "Receive interrupted (received %u bytes without terminator before that)",
                data.size()));
        }

        // Wait for a short while (or the socket to become ready for reading) before retrying.
        const auto wait_time = std::min(deadline - now, std::chrono::milliseconds{MAX_WAIT_FOR_IO});
        (void)Wait(wait_time, RECV);
    }
}